

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_kmgmt.c
# Opt level: O0

int sm2_validate(void *keydata,int selection,int checktype)

{
  int iVar1;
  BN_CTX *ctx_00;
  EC_GROUP *group;
  int in_EDX;
  uint in_ESI;
  EC_KEY *in_RDI;
  BN_CTX *ctx;
  int ok;
  EC_KEY *eck;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar2;
  undefined1 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  bool bVar3;
  undefined1 in_stack_ffffffffffffffcf;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar4 = 1;
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    uVar4 = 0;
  }
  else if ((in_ESI & 0x87) == 0) {
    uVar4 = 1;
  }
  else {
    ossl_ec_key_get_libctx(in_RDI);
    ctx_00 = BN_CTX_new_ex((OSSL_LIB_CTX *)
                           CONCAT17(in_stack_ffffffffffffffcf,
                                    CONCAT16(in_stack_ffffffffffffffce,
                                             CONCAT15(in_stack_ffffffffffffffcd,
                                                      CONCAT14(in_stack_ffffffffffffffcc,
                                                               in_stack_ffffffffffffffc8)))));
    if (ctx_00 == (BN_CTX *)0x0) {
      uVar4 = 0;
    }
    else {
      if ((in_ESI & 4) != 0) {
        in_stack_ffffffffffffffcf = false;
        if (uVar4 != 0) {
          group = EC_KEY_get0_group((EC_KEY *)in_RDI);
          iVar1 = EC_GROUP_check(group,(BN_CTX *)ctx_00);
          in_stack_ffffffffffffffcf = iVar1 != 0;
        }
        uVar4 = (uint)(byte)in_stack_ffffffffffffffcf;
      }
      if ((in_ESI & 2) != 0) {
        if (in_EDX == 1) {
          bVar3 = false;
          if (uVar4 != 0) {
            iVar1 = ossl_ec_key_public_check_quick
                              ((EC_KEY *)
                               CONCAT17(in_stack_ffffffffffffffcf,
                                        (uint7)CONCAT15(in_stack_ffffffffffffffcd,
                                                        CONCAT14(in_stack_ffffffffffffffcc,
                                                                 in_stack_ffffffffffffffc8))),
                               (BN_CTX *)0x334bc0);
            bVar3 = iVar1 != 0;
          }
        }
        else {
          bVar3 = false;
          if (uVar4 != 0) {
            iVar1 = ossl_ec_key_public_check((EC_KEY *)CONCAT44(in_ESI,in_EDX),(BN_CTX *)in_RDI);
            bVar3 = iVar1 != 0;
          }
        }
        uVar4 = (uint)bVar3;
      }
      if ((in_ESI & 1) != 0) {
        bVar3 = false;
        if (uVar4 != 0) {
          iVar1 = ossl_sm2_key_private_check
                            ((EC_KEY *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                            );
          bVar3 = iVar1 != 0;
        }
        uVar4 = (uint)bVar3;
      }
      if ((in_ESI & 3) == 3) {
        uVar2 = 0;
        if (uVar4 != 0) {
          iVar1 = ossl_ec_key_pairwise_check
                            ((EC_KEY *)CONCAT44(uVar4,in_stack_ffffffffffffffd8),ctx_00);
          uVar2 = (uint)(iVar1 != 0) << 0x18;
        }
        uVar4 = uVar2 >> 0x18;
      }
      BN_CTX_free((BN_CTX *)ctx_00);
    }
  }
  return uVar4;
}

Assistant:

static
int sm2_validate(const void *keydata, int selection, int checktype)
{
    const EC_KEY *eck = keydata;
    int ok = 1;
    BN_CTX *ctx = NULL;

    if (!ossl_prov_is_running())
        return 0;

    if ((selection & EC_POSSIBLE_SELECTIONS) == 0)
        return 1; /* nothing to validate */

    ctx = BN_CTX_new_ex(ossl_ec_key_get_libctx(eck));
    if  (ctx == NULL)
        return 0;

    if ((selection & OSSL_KEYMGMT_SELECT_DOMAIN_PARAMETERS) != 0)
        ok = ok && EC_GROUP_check(EC_KEY_get0_group(eck), ctx);

    if ((selection & OSSL_KEYMGMT_SELECT_PUBLIC_KEY) != 0) {
        if (checktype == OSSL_KEYMGMT_VALIDATE_QUICK_CHECK)
            ok = ok && ossl_ec_key_public_check_quick(eck, ctx);
        else
            ok = ok && ossl_ec_key_public_check(eck, ctx);
    }

    if ((selection & OSSL_KEYMGMT_SELECT_PRIVATE_KEY) != 0)
        ok = ok && ossl_sm2_key_private_check(eck);

    if ((selection & OSSL_KEYMGMT_SELECT_KEYPAIR) == OSSL_KEYMGMT_SELECT_KEYPAIR)
        ok = ok && ossl_ec_key_pairwise_check(eck, ctx);

    BN_CTX_free(ctx);
    return ok;
}